

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

vertex_descriptor __thiscall
tsbp::LeftmostActiveOnly::AddLeafNode(LeftmostActiveOnly *this,Node *node)

{
  vertex_descriptor v;
  vertex_bundled *this_00;
  size_type sVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  size_type sVar2;
  reference this_02;
  size_t remainingItemsToPlace;
  Node *newNode;
  vertex_descriptor newNodeId;
  Node *node_local;
  LeftmostActiveOnly *this_local;
  
  v = boost::
      add_vertex<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::directedS,tsbp::LeftmostActiveOnly::Node,boost::no_property,boost::no_property,boost::listS>::config>>
                (&(this->tree).super_type);
  this_00 = boost::
            adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>
            ::operator[](&this->tree,v);
  sVar1 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
  this_01 = Node::PlacedItems(node);
  sVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_01);
  this_02 = std::
            vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::LeftmostActiveOnly::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
            ::operator[](&(this->tree).super_type.m_vertices,v);
  std::
  vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
  ::reserve((vector<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>_>
             *)this_02,(sVar1 - sVar2) + 1);
  Node::operator=(this_00,node);
  return v;
}

Assistant:

LeftmostActiveOnly::SearchTree::vertex_descriptor LeftmostActiveOnly::AddLeafNode(Node&& node)
{
    SearchTree::vertex_descriptor newNodeId = boost::add_vertex(this->tree);
    ////assert(node.Id == newNodeId);

    Node& newNode = this->tree[newNodeId];
    size_t remainingItemsToPlace = this->items.size() - node.PlacedItems().count();

    // TODO.Performance: this is helpful with directionalS and bidirectionalS. With bidirectionalS, edges are additionally (?) stored as members of tree.m_edges.
    this->tree.m_vertices[newNodeId].m_out_edges.reserve(remainingItemsToPlace + 1);

    newNode = std::move(node);

    return newNodeId;
}